

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

void xm_envelope_tick(xm_channel_context_t *ch,xm_envelope_t *env,uint16_t *counter,float *outval)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  float fVar6;
  
  uVar3 = (uint)env->num_points;
  if (uVar3 < 2) {
    if (uVar3 != 1) {
      return;
    }
    fVar6 = (float)env->points[0].value * 0.015625;
    *outval = fVar6;
    if (fVar6 <= 1.0) {
      return;
    }
    *outval = 1.0;
    return;
  }
  uVar2 = *counter;
  if ((env->loop_enabled == true) &&
     (uVar4 = env->points[env->loop_end_point].frame, uVar4 <= uVar2)) {
    uVar2 = (uVar2 - uVar4) + env->points[env->loop_start_point].frame;
    *counter = uVar2;
  }
  for (bVar5 = 0; (uint)bVar5 < uVar3 - 2; bVar5 = bVar5 + 1) {
    uVar4 = env->points[bVar5].frame;
    if ((uVar4 <= uVar2) && (uVar2 <= env->points[(ulong)bVar5 + 1].frame)) goto LAB_00107405;
  }
  uVar4 = env->points[bVar5].frame;
LAB_00107405:
  if (uVar4 < uVar2) {
    uVar1 = env->points[(ulong)bVar5 + 1].frame;
    if (uVar2 < uVar1) {
      fVar6 = (float)(int)((uint)uVar2 - (uint)uVar4) / (float)(int)((uint)uVar1 - (uint)uVar4);
      fVar6 = (float)env->points[(ulong)bVar5 + 1].value * fVar6 +
              (1.0 - fVar6) * (float)env->points[bVar5].value;
      goto LAB_00107476;
    }
    uVar4 = env->points[(ulong)bVar5 + 1].value;
  }
  else {
    uVar4 = env->points[bVar5].value;
  }
  fVar6 = (float)uVar4;
LAB_00107476:
  *outval = fVar6 * 0.015625;
  if (((ch->sustained != true) || (env->sustain_enabled != true)) ||
     (uVar2 != env->points[env->sustain_point].frame)) {
    *counter = uVar2 + 1;
  }
  return;
}

Assistant:

static void xm_envelope_tick(xm_channel_context_t* ch,
							 xm_envelope_t* env,
							 uint16_t* counter,
							 float* outval) {
	if(env->num_points < 2) {
		/* Don't really know what to do… */
		if(env->num_points == 1) {
			/* XXX I am pulling this out of my ass */
			*outval = (float)env->points[0].value / (float)0x40;
			if(*outval > 1) {
				*outval = 1;
			}
		}

		return;
	} else {
		uint8_t j;

		if(env->loop_enabled) {
			uint16_t loop_start = env->points[env->loop_start_point].frame;
			uint16_t loop_end = env->points[env->loop_end_point].frame;
			uint16_t loop_length = loop_end - loop_start;

			if(*counter >= loop_end) {
				*counter -= loop_length;
			}
		}

		for(j = 0; j < (env->num_points - 2); ++j) {
			if(env->points[j].frame <= *counter &&
			   env->points[j+1].frame >= *counter) {
				break;
			}
		}

		*outval = xm_envelope_lerp(env->points + j, env->points + j + 1, *counter) / (float)0x40;

		/* Make sure it is safe to increment frame count */
		if(!ch->sustained || !env->sustain_enabled ||
		   *counter != env->points[env->sustain_point].frame) {
			(*counter)++;
		}
	}
}